

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_test.cc
# Opt level: O1

void __thiscall
xLearn::MetricTest_Create_Metric_Test::~MetricTest_Create_Metric_Test
          (MetricTest_Create_Metric_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(MetricTest, Create_Metric) {
  EXPECT_TRUE(CreateMetric("acc") != NULL);
  EXPECT_TRUE(CreateMetric("prec") != NULL);
  EXPECT_TRUE(CreateMetric("recall") != NULL);
  EXPECT_TRUE(CreateMetric("f1") != NULL);
  EXPECT_TRUE(CreateMetric("auc") != NULL);
  EXPECT_TRUE(CreateMetric("mae") != NULL);
  EXPECT_TRUE(CreateMetric("mape") != NULL);
  EXPECT_TRUE(CreateMetric("rmsd") != NULL);
  EXPECT_TRUE(CreateMetric("") == NULL);
  EXPECT_TRUE(CreateMetric("unknow_name") == NULL);
}